

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sec.c
# Opt level: O0

void sec_flush_some_and_unlock(tsdn_t *tsdn,sec_t *sec,sec_shard_t *shard)

{
  long in_RDX;
  long in_RSI;
  _Bool deferred_work_generated;
  sec_bin_t *bin;
  edata_list_active_t to_flush;
  tsdn_t *in_stack_ffffffffffffffc8;
  uint7 in_stack_ffffffffffffffd0;
  pai_t *in_stack_ffffffffffffffd8;
  edata_list_active_t in_stack_ffffffffffffffe0;
  
  malloc_mutex_assert_owner(in_stack_ffffffffffffffc8,(malloc_mutex_t *)0x25695f2);
  edata_list_active_init((edata_list_active_t *)&stack0xffffffffffffffe0);
  while (*(ulong *)(in_RSI + 0x58) < *(ulong *)(in_RDX + 0x80)) {
    in_stack_ffffffffffffffd8 =
         (pai_t *)(*(long *)(in_RDX + 0x78) + (ulong)*(uint *)(in_RDX + 0x88) * 0x18);
    *(int *)(in_RDX + 0x88) = *(int *)(in_RDX + 0x88) + 1;
    if (*(int *)(in_RDX + 0x88) == *(int *)(in_RSI + 0x70)) {
      *(undefined4 *)(in_RDX + 0x88) = 0;
    }
    if (in_stack_ffffffffffffffd8->alloc_batch !=
        (_func_size_t_tsdn_t_ptr_pai_t_ptr_size_t_size_t_edata_list_active_t_ptr__Bool__Bool_ptr *)
        0x0) {
      *(long *)(in_RDX + 0x80) =
           *(long *)(in_RDX + 0x80) - (long)in_stack_ffffffffffffffd8->alloc_batch;
      in_stack_ffffffffffffffd8->alloc_batch =
           (_func_size_t_tsdn_t_ptr_pai_t_ptr_size_t_size_t_edata_list_active_t_ptr__Bool__Bool_ptr
            *)0x0;
      edata_list_active_concat
                ((edata_list_active_t *)&stack0xffffffffffffffe0,
                 (edata_list_active_t *)&in_stack_ffffffffffffffd8->expand);
    }
  }
  malloc_mutex_unlock((tsdn_t *)in_stack_ffffffffffffffe0.head.qlh_first,
                      (malloc_mutex_t *)in_stack_ffffffffffffffd8);
  pai_dalloc_batch((tsdn_t *)in_stack_ffffffffffffffe0.head.qlh_first,in_stack_ffffffffffffffd8,
                   (edata_list_active_t *)(ulong)in_stack_ffffffffffffffd0,
                   (_Bool *)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

static void
sec_flush_some_and_unlock(tsdn_t *tsdn, sec_t *sec, sec_shard_t *shard) {
	malloc_mutex_assert_owner(tsdn, &shard->mtx);
	edata_list_active_t to_flush;
	edata_list_active_init(&to_flush);
	while (shard->bytes_cur > sec->opts.bytes_after_flush) {
		/* Pick a victim. */
		sec_bin_t *bin = &shard->bins[shard->to_flush_next];

		/* Update our victim-picking state. */
		shard->to_flush_next++;
		if (shard->to_flush_next == sec->npsizes) {
			shard->to_flush_next = 0;
		}

		assert(shard->bytes_cur >= bin->bytes_cur);
		if (bin->bytes_cur != 0) {
			shard->bytes_cur -= bin->bytes_cur;
			bin->bytes_cur = 0;
			edata_list_active_concat(&to_flush, &bin->freelist);
		}
		/*
		 * Either bin->bytes_cur was 0, in which case we didn't touch
		 * the bin list but it should be empty anyways (or else we
		 * missed a bytes_cur update on a list modification), or it
		 * *was* 0 and we emptied it ourselves.  Either way, it should
		 * be empty now.
		 */
		assert(edata_list_active_empty(&bin->freelist));
	}

	malloc_mutex_unlock(tsdn, &shard->mtx);
	bool deferred_work_generated = false;
	pai_dalloc_batch(tsdn, sec->fallback, &to_flush,
	    &deferred_work_generated);
}